

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O0

int archive_write_set_format_gnutar(archive *_a)

{
  void *pvVar1;
  gnutar *gnutar;
  archive_write *a;
  archive *_a_local;
  
  pvVar1 = calloc(1,0x68);
  if (pvVar1 == (void *)0x0) {
    archive_set_error(_a,0xc,"Can\'t allocate gnutar data");
    _a_local._4_4_ = -0x1e;
  }
  else {
    _a[1].read_data_offset = (int64_t)pvVar1;
    _a[1].read_data_output_offset = (int64_t)"gnutar";
    *(code **)&_a[1].read_data_is_posix_read = archive_write_gnutar_options;
    *(code **)(_a + 2) = archive_write_gnutar_header;
    _a[2].vtable = (archive_vtable_conflict *)archive_write_gnutar_data;
    *(code **)&_a[2].archive_format = archive_write_gnutar_close;
    _a[2].archive_format_name = (char *)archive_write_gnutar_free;
    _a[1].read_data_requested = (size_t)archive_write_gnutar_finish_entry;
    _a->archive_format = 0x30004;
    _a->archive_format_name = "GNU tar";
    _a_local._4_4_ = 0;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_set_format_gnutar(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct gnutar *gnutar;

	gnutar = calloc(1, sizeof(*gnutar));
	if (gnutar == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate gnutar data");
		return (ARCHIVE_FATAL);
	}
	a->format_data = gnutar;
	a->format_name = "gnutar";
	a->format_options = archive_write_gnutar_options;
	a->format_write_header = archive_write_gnutar_header;
	a->format_write_data = archive_write_gnutar_data;
	a->format_close = archive_write_gnutar_close;
	a->format_free = archive_write_gnutar_free;
	a->format_finish_entry = archive_write_gnutar_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
	a->archive.archive_format_name = "GNU tar";
	return (ARCHIVE_OK);
}